

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
Shell::doAssertion(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,Assertion *assn)

{
  add_pointer_t<wasm::WATParser::AssertReturn> assn_00;
  add_pointer_t<wasm::WATParser::AssertAction> assn_01;
  add_pointer_t<wasm::WATParser::AssertModule> assn_02;
  type *mod;
  type *act;
  type *ret;
  Assertion *assn_local;
  Shell *this_local;
  
  assn_00 = std::
            get_if<wasm::WATParser::AssertReturn,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                      (assn);
  if (assn_00 == (add_pointer_t<wasm::WATParser::AssertReturn>)0x0) {
    assn_01 = std::
              get_if<wasm::WATParser::AssertAction,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                        (assn);
    if (assn_01 == (add_pointer_t<wasm::WATParser::AssertAction>)0x0) {
      assn_02 = std::
                get_if<wasm::WATParser::AssertModule,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                          (assn);
      if (assn_02 == (add_pointer_t<wasm::WATParser::AssertModule>)0x0) {
        ::wasm::handle_unreachable
                  ("unexpected assertion",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                   ,0xfd);
      }
      assertModule(__return_storage_ptr__,this,assn_02);
    }
    else {
      assertAction(__return_storage_ptr__,this,assn_01);
    }
  }
  else {
    assertReturn(__return_storage_ptr__,this,assn_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> doAssertion(Assertion& assn) {
    if (auto* ret = std::get_if<AssertReturn>(&assn)) {
      return assertReturn(*ret);
    } else if (auto* act = std::get_if<AssertAction>(&assn)) {
      return assertAction(*act);
    } else if (auto* mod = std::get_if<AssertModule>(&assn)) {
      return assertModule(*mod);
    } else {
      WASM_UNREACHABLE("unexpected assertion");
    }
  }